

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

Vec4 __thiscall
tcu::ConstPixelBufferAccess::sample1DOffset
          (ConstPixelBufferAccess *this,Sampler *sampler,FilterMode filter,float s,IVec2 *offset)

{
  WrapMode WVar1;
  WrapMode WVar2;
  undefined1 auVar3 [16];
  int i;
  WrapMode WVar4;
  WrapMode WVar5;
  TextureChannelClass TVar6;
  long lVar7;
  int iVar8;
  WrapMode WVar9;
  undefined4 in_register_00000014;
  Sampler *sampler_00;
  Vector<float,_4> *res_6;
  WrapMode WVar10;
  IVec2 *in_R8;
  uint uVar11;
  float fVar12;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Vec4 VVar18;
  Vector<float,_4> res_4;
  Vec4 p1;
  Vec4 p0;
  Vector<float,_4> res_5;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [32];
  void *local_48;
  undefined8 uStack_40;
  
  sampler_00 = (Sampler *)CONCAT44(in_register_00000014,filter);
  auVar14._0_8_ = CONCAT44(in_XMM0_Db,s);
  auVar14._8_4_ = in_XMM0_Dc;
  auVar14._12_4_ = in_XMM0_Dd;
  if (sampler_00->normalizedCoords == true) {
    WVar1 = sampler_00->wrapS;
    auVar15._4_12_ = auVar14._4_12_;
    if (WVar1 < WRAPMODE_LAST) {
      WVar2 = sampler->wrapR;
      if ((0x57U >> (WVar1 & 0x1f) & 1) == 0) {
        if (WVar1 == REPEAT_CL) {
          fVar12 = floorf(s);
          auVar16._0_4_ = s - fVar12;
          auVar16._4_12_ = auVar15._4_12_;
        }
        else {
          local_68._28_4_ = s * 0.5;
          fVar12 = floorf((float)local_68._28_4_);
          fVar12 = (float)local_68._28_4_ - fVar12;
          if ((fVar12 != 0.5) || (NAN(fVar12))) {
            fVar13 = floorf((float)local_68._28_4_ + 0.5);
          }
          else {
            fVar13 = 0.0;
            if (((long)((float)local_68._28_4_ - fVar12) & 1U) != 0) {
              fVar13 = 1.0;
            }
            fVar13 = ((float)local_68._28_4_ - fVar12) + fVar13;
          }
          fVar12 = s - (fVar13 + fVar13);
          uVar11 = -(uint)(-fVar12 <= fVar12);
          auVar3._4_4_ = in_XMM0_Db & (in_XMM0_Db ^ 0x80000000);
          auVar3._0_4_ = (uint)fVar12 & uVar11;
          auVar3._8_4_ = in_XMM0_Dc & (in_XMM0_Dc ^ 0x80000000);
          auVar3._12_4_ = in_XMM0_Dd & (in_XMM0_Dd ^ 0x80000000);
          auVar16 = ZEXT416(~uVar11 & (uint)-fVar12) | auVar3;
        }
        auVar17._4_12_ = auVar16._4_12_;
        auVar17._0_4_ = auVar16._0_4_ * (float)(int)WVar2;
        auVar14._0_8_ = auVar17._0_8_;
      }
      else {
        auVar15._0_4_ = s * (float)(int)WVar2;
        auVar14._0_8_ = auVar15._0_8_;
      }
    }
    else {
      auVar14._0_8_ = 0;
    }
  }
  if ((int)offset == 0) {
    VVar18 = sampleNearest1D((tcu *)this,(ConstPixelBufferAccess *)sampler,sampler_00,
                             (float)auVar14._0_8_,in_R8);
    auVar14._0_8_ = VVar18.m_data._8_8_;
    fVar12 = VVar18.m_data[0];
    fVar13 = VVar18.m_data[1];
  }
  else if ((int)offset == 1) {
    WVar1 = sampler->wrapR;
    fVar13 = (float)auVar14._0_8_ + -0.5;
    fVar12 = floorf(fVar13);
    WVar2 = sampler_00->wrapS;
    WVar10 = CLAMP_TO_EDGE;
    if (WVar2 < WRAPMODE_LAST) {
      WVar5 = in_R8->m_data[0] + (int)fVar12;
      WVar10 = WVar5;
      switch(WVar2) {
      default:
        WVar4 = WVar1 - CLAMP_TO_BORDER;
        if ((int)WVar5 < (int)(WVar1 - CLAMP_TO_BORDER)) {
          WVar4 = WVar5;
        }
        WVar10 = CLAMP_TO_EDGE;
        if (-1 < (int)WVar5) {
          WVar10 = WVar4;
        }
        break;
      case CLAMP_TO_BORDER:
        WVar4 = WVar1;
        if ((int)WVar5 < (int)WVar1) {
          WVar4 = WVar5;
        }
        WVar10 = ~CLAMP_TO_EDGE;
        if (-2 < (int)WVar5) {
          WVar10 = WVar4;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        WVar10 = ((int)WVar5 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar5 % (int)WVar1;
        break;
      case MIRRORED_ONCE:
        WVar10 = WVar1;
        if ((int)WVar5 < (int)WVar1) {
          WVar10 = WVar5;
        }
        if (SBORROW4(WVar5,-WVar1) != (int)(WVar5 + WVar1) < 0) {
          WVar10 = -WVar1;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)WVar10 % (int)(WVar1 * 2);
        uVar11 = (iVar8 - WVar1) + (iVar8 >> 0x1f & WVar1 * 2);
        WVar10 = ~((int)uVar11 >> 0x1f ^ uVar11) + WVar1;
      }
    }
    WVar5 = CLAMP_TO_EDGE;
    if (WVar2 < WRAPMODE_LAST) {
      WVar4 = in_R8->m_data[0] + (int)fVar12 + CLAMP_TO_BORDER;
      WVar5 = WVar4;
      switch(WVar2) {
      default:
        WVar9 = WVar1 - CLAMP_TO_BORDER;
        if ((int)WVar4 < (int)(WVar1 - CLAMP_TO_BORDER)) {
          WVar9 = WVar4;
        }
        WVar5 = CLAMP_TO_EDGE;
        if (-1 < (int)WVar4) {
          WVar5 = WVar9;
        }
        break;
      case CLAMP_TO_BORDER:
        WVar9 = WVar1;
        if ((int)WVar4 < (int)WVar1) {
          WVar9 = WVar4;
        }
        WVar5 = ~CLAMP_TO_EDGE;
        if (-2 < (int)WVar4) {
          WVar5 = WVar9;
        }
        break;
      case REPEAT_GL:
      case REPEAT_CL:
        WVar5 = ((int)WVar4 % (int)WVar1 >> 0x1f & WVar1) + (int)WVar4 % (int)WVar1;
        break;
      case MIRRORED_ONCE:
        WVar5 = WVar1;
        if ((int)WVar4 < (int)WVar1) {
          WVar5 = WVar4;
        }
        if (SBORROW4(WVar4,-WVar1) != (int)(WVar4 + WVar1) < 0) {
          WVar5 = -WVar1;
        }
      case MIRRORED_REPEAT_GL:
        iVar8 = (int)WVar5 % (int)(WVar1 * 2);
        uVar11 = (iVar8 - WVar1) + (iVar8 >> 0x1f & WVar1 * 2);
        WVar5 = ~((int)uVar11 >> 0x1f ^ uVar11) + WVar1;
      }
    }
    if ((WVar2 == CLAMP_TO_BORDER) && ((int)WVar10 < 0 || (int)WVar1 <= (int)WVar10)) {
      TVar6 = getTextureChannelClass(sampler->wrapT);
      switch(TVar6) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        sampleTextureBorder<float>((tcu *)local_68,(TextureFormat *)sampler,sampler_00);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((tcu *)&local_88,(TextureFormat *)sampler,sampler_00);
        local_68._0_4_ = R;
        local_68._4_4_ = SNORM_INT8;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        lVar7 = 0;
        do {
          *(float *)(local_68 + lVar7 * 4) = (float)*(int *)((long)&local_88 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((tcu *)&local_88,(TextureFormat *)sampler,sampler_00);
        local_68._0_4_ = R;
        local_68._4_4_ = SNORM_INT8;
        local_68._8_4_ = 0;
        local_68._12_4_ = 0;
        lVar7 = 0;
        do {
          *(float *)(local_68 + lVar7 * 4) = (float)*(uint *)((long)&local_88 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      default:
        lVar7 = 0;
        do {
          *(undefined4 *)(local_68 + lVar7 * 4) = 0xbf800000;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
    }
    else {
      lookup((ConstPixelBufferAccess *)local_68,(int)sampler,WVar10,in_R8->m_data[1]);
    }
    fVar13 = fVar13 - fVar12;
    if ((int)WVar5 < (int)WVar1 && -1 < (int)WVar5 || WVar2 != CLAMP_TO_BORDER) {
      lookup((ConstPixelBufferAccess *)local_78,(int)sampler,WVar5,in_R8->m_data[1]);
    }
    else {
      TVar6 = getTextureChannelClass(sampler->wrapT);
      switch(TVar6) {
      case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
      case TEXTURECHANNELCLASS_FLOATING_POINT:
        sampleTextureBorder<float>((tcu *)local_78,(TextureFormat *)sampler,sampler_00);
        break;
      case TEXTURECHANNELCLASS_SIGNED_INTEGER:
        sampleTextureBorder<int>((tcu *)&local_88,(TextureFormat *)sampler,sampler_00);
        local_78._0_4_ = R;
        local_78._4_4_ = SNORM_INT8;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        lVar7 = 0;
        do {
          *(float *)(local_78 + lVar7 * 4) = (float)*(int *)((long)&local_88 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
        sampleTextureBorder<unsigned_int>((tcu *)&local_88,(TextureFormat *)sampler,sampler_00);
        local_78._0_4_ = R;
        local_78._4_4_ = SNORM_INT8;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        lVar7 = 0;
        do {
          *(float *)(local_78 + lVar7 * 4) = (float)*(uint *)((long)&local_88 + lVar7 * 4);
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        break;
      default:
        lVar7 = 0;
        do {
          *(undefined4 *)(local_78 + lVar7 * 4) = 0xbf800000;
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
      }
    }
    local_88 = 0;
    uStack_80 = 0;
    lVar7 = 0;
    do {
      fVar12 = *(float *)(local_68 + lVar7 * 4) * (1.0 - fVar13);
      auVar14._0_8_ = (ulong)(uint)fVar12;
      *(float *)((long)&local_88 + lVar7 * 4) = fVar12;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    local_48 = (void *)0x0;
    uStack_40 = 0;
    lVar7 = 0;
    do {
      *(float *)((long)&local_48 + lVar7 * 4) = *(float *)(local_78 + lVar7 * 4) * fVar13;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
    lVar7 = 0;
    do {
      fVar13 = 0.0;
      fVar12 = *(float *)((long)&local_88 + lVar7 * 4) + *(float *)((long)&local_48 + lVar7 * 4);
      (this->m_size).m_data[lVar7 + -2] = (int)fVar12;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
  }
  else {
    fVar12 = 0.0;
    fVar13 = 0.0;
    (this->m_format).order = R;
    (this->m_format).type = SNORM_INT8;
    (this->m_size).m_data[0] = 0;
    (this->m_size).m_data[1] = 0;
  }
  VVar18.m_data[1] = fVar13;
  VVar18.m_data[0] = fVar12;
  VVar18.m_data[2] = (float)(int)auVar14._0_8_;
  VVar18.m_data[3] = (float)(int)(auVar14._0_8_ >> 0x20);
  return (Vec4)VVar18.m_data;
}

Assistant:

Vec4 ConstPixelBufferAccess::sample1DOffset (const Sampler& sampler, Sampler::FilterMode filter, float s, const IVec2& offset) const
{
	// check selected layer exists
	// \note offset.x is X offset, offset.y is the selected layer
	DE_ASSERT(de::inBounds(offset.y(), 0, m_size.y()));

	// Non-normalized coordinates.
	float u = s;

	if (sampler.normalizedCoords)
		u = unnormalize(sampler.wrapS, s, m_size.x());

	switch (filter)
	{
		case Sampler::NEAREST:	return sampleNearest1D	(*this, sampler, u, offset);
		case Sampler::LINEAR:	return sampleLinear1D	(*this, sampler, u, offset);
		default:
			DE_ASSERT(DE_FALSE);
			return Vec4(0.0f);
	}
}